

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketClient.cpp
# Opt level: O2

void __thiscall SocketClient::bytesWritten(SocketClient *this,SharedPtr *socket,uint64_t bytes)

{
  uint64_t copy;
  uint64_t local_8;
  
  local_8 = bytes;
  Signal<std::function<void(std::shared_ptr<SocketClient>const&,int)>>::operator()
            ((Signal<std::function<void(std::shared_ptr<SocketClient>const&,int)>> *)
             &this->mSignalBytesWritten,socket,&local_8);
  return;
}

Assistant:

void SocketClient::bytesWritten(const SocketClient::SharedPtr &socket, uint64_t bytes)
{
    const uint64_t copy = bytes;
#ifdef RCT_SOCKETCLIENT_TIMING_ENABLED
    List<TimeData>::iterator it = mPendingWrites.begin();
    while (bytes && it != mPendingWrites.end()) {
        if (it->add(bytes)) {
            mWrites.append(*it);
            it = mPendingWrites.erase(it);
        } else {
            ++it;
        }
    }
    assert(!bytes);
#endif
    mSignalBytesWritten(socket, copy);
}